

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleFans.cpp
# Opt level: O2

O3DGCErrorCode o3dgc::LoadIntData(Vector<long> *data,BinaryStream *bstream,unsigned_long *iterator)

{
  unsigned_long size;
  bool bVar1;
  long local_30;
  
  BinaryStream::ReadUInt32ASCII(bstream,iterator);
  size = BinaryStream::ReadUInt32ASCII(bstream,iterator);
  Vector<long>::Allocate(data,size);
  data->m_size = 0;
  while (bVar1 = size != 0, size = size - 1, bVar1) {
    local_30 = BinaryStream::ReadIntASCII(bstream,iterator);
    Vector<long>::PushBack(data,&local_30);
  }
  return O3DGC_OK;
}

Assistant:

O3DGCErrorCode    LoadIntData(Vector<long> & data,
                                  const BinaryStream & bstream,
                                  unsigned long & iterator) 
    {
        bstream.ReadUInt32ASCII(iterator);
        const unsigned long size = bstream.ReadUInt32ASCII(iterator);
        data.Allocate(size);
        data.Clear();
        for(unsigned long i = 0; i < size; ++i)
        {
            data.PushBack(bstream.ReadIntASCII(iterator));
        }
        return O3DGC_OK;
    }